

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O2

int add_func_var(JSContext *ctx,JSFunctionDef *fd,JSAtom name)

{
  undefined1 *puVar1;
  uint uVar2;
  
  if (-1 < fd->func_var_idx) {
    return fd->func_var_idx;
  }
  uVar2 = add_var(ctx,fd,name);
  if (-1 < (int)uVar2) {
    fd->func_var_idx = uVar2;
    *(uint *)&fd->vars[uVar2].field_0xc = *(uint *)&fd->vars[uVar2].field_0xc & 0xffffff87 | 0x20;
    if ((fd->js_mode & 1) != 0) {
      puVar1 = &fd->vars[uVar2].field_0xc;
      *(uint *)puVar1 = *(uint *)puVar1 | 1;
    }
  }
  return uVar2;
}

Assistant:

static int add_func_var(JSContext *ctx, JSFunctionDef *fd, JSAtom name)
{
    int idx = fd->func_var_idx;
    if (idx < 0 && (idx = add_var(ctx, fd, name)) >= 0) {
        fd->func_var_idx = idx;
        fd->vars[idx].var_kind = JS_VAR_FUNCTION_NAME;
        if (fd->js_mode & JS_MODE_STRICT)
            fd->vars[idx].is_const = TRUE;
    }
    return idx;
}